

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

string * __thiscall
llvm::yaml::Node::getVerbatimTag_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  ulong uVar1;
  short *psVar2;
  _Base_ptr p_Var3;
  Child LHS;
  Child CVar4;
  long lVar5;
  ulong uVar6;
  const_iterator cVar8;
  Child RHS;
  char *pcVar9;
  char *pcVar10;
  ulong *puVar11;
  bool bVar12;
  StringRef TagHandle;
  ulong *local_c0;
  short *local_b8;
  ulong uStack_b0;
  ulong *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  Child local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  Child local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  key_type local_40;
  ulong uVar7;
  
  uVar1 = (this->Tag).Length;
  if ((uVar1 == 0) || ((psVar2 = (short *)(this->Tag).Data, uVar1 == 1 && ((char)*psVar2 == '!'))))
  {
    switch(this->TypeID) {
    case 0:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "tag:yaml.org,2002:null";
      pcVar9 = "";
      break;
    case 1:
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "tag:yaml.org,2002:str";
      pcVar9 = "";
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "";
      pcVar10 = "";
      break;
    case 4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "tag:yaml.org,2002:map";
      pcVar9 = "";
      break;
    case 5:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "tag:yaml.org,2002:seq";
      pcVar9 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar9)
    ;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar7 = uVar1;
  do {
    uVar6 = uVar7 - 1;
    if (uVar7 == 0) goto LAB_001ce2ff;
    lVar5 = uVar7 - 1;
    uVar7 = uVar6;
  } while (*(char *)((long)psVar2 + lVar5) != '!');
  if (uVar6 == 0) {
    local_88.twine = (Twine *)0x1fc04b;
    uStack_80 = 1;
    cVar8 = std::
            _Rb_tree<llvm::StringRef,_std::pair<const_llvm::StringRef,_llvm::StringRef>,_std::_Select1st<std::pair<const_llvm::StringRef,_llvm::StringRef>_>,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
            ::find(&(((this->Doc->_M_t).
                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->TagMap).
                    _M_t,(key_type *)&local_88);
    p_Var3 = cVar8._M_node[1]._M_left;
    if (p_Var3 == (_Base_ptr)0x0) {
      local_c0 = &uStack_b0;
      local_b8 = (short *)0x0;
      uStack_b0 = uStack_b0 & 0xffffffffffffff00;
    }
    else {
      local_c0 = &uStack_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,p_Var3,
                 (long)&p_Var3->_M_color + (long)&(cVar8._M_node[1]._M_right)->_M_color);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
    if (local_c0 != &uStack_b0) {
      operator_delete(local_c0,uStack_b0 + 1);
    }
    pcVar9 = (char *)((long)psVar2 + 1);
    goto LAB_001ce6b8;
  }
LAB_001ce2ff:
  uVar7 = uVar1;
  if ((uVar1 == 1) || (*psVar2 != 0x2121)) {
    do {
      local_40.Length = uVar7;
      if (local_40.Length == 0) break;
      uVar7 = local_40.Length - 1;
    } while (*(char *)((long)psVar2 + (local_40.Length - 1)) != '!');
    if (uVar1 < local_40.Length) {
      local_40.Length = uVar1;
    }
    local_40.Data = (char *)psVar2;
    cVar8 = std::
            _Rb_tree<llvm::StringRef,_std::pair<const_llvm::StringRef,_llvm::StringRef>,_std::_Select1st<std::pair<const_llvm::StringRef,_llvm::StringRef>_>,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
            ::find(&(((this->Doc->_M_t).
                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->TagMap).
                    _M_t,&local_40);
    uVar7 = uVar1;
    if (cVar8._M_node ==
        (_Base_ptr)
        ((long)&(((this->Doc->_M_t).
                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->TagMap)._M_t
        + 8U)) {
      local_a8 = (ulong *)&local_98;
      local_a0 = 0;
      local_98 = 0;
      local_c0 = (ulong *)CONCAT44(local_c0._4_4_,0x16);
      local_b8 = (short *)local_40.Data;
      uStack_b0 = local_40.Length;
      Twine::Twine((Twine *)&local_58,"Unknown tag handle ");
      Twine::Twine((Twine *)&local_70,&local_40);
      if ((local_48 == NullKind) || (local_60 == NullKind)) {
        local_78 = CONCAT62(local_78._2_6_,0x100);
      }
      else {
        if (local_48 == EmptyKind) {
          local_78 = CONCAT62(uStack_5e,CONCAT11(cStack_5f,local_60));
        }
        else {
          if (local_60 != EmptyKind) {
            LHS._4_4_ = uStack_54;
            LHS.decUI = local_58;
            if (cStack_47 != '\x01') {
              local_48 = TwineKind;
              LHS.twine = (Twine *)&local_58;
            }
            if (cStack_5f != '\x01') {
              local_60 = TwineKind;
            }
            CVar4._4_4_ = local_70._4_4_;
            CVar4.decUI = local_70.decUI;
            RHS.twine = (Twine *)&local_70;
            if (cStack_5f == '\x01') {
              RHS = CVar4;
            }
            Twine::Twine((Twine *)&local_88,LHS,local_48,RHS,local_60);
            goto LAB_001ce663;
          }
          local_78 = CONCAT62(uStack_46,CONCAT11(cStack_47,local_48));
          local_70.decUI = local_58;
          local_70._4_4_ = uStack_54;
          uStack_68 = uStack_50;
          uStack_64 = uStack_4c;
        }
        local_88._4_4_ = local_70._4_4_;
        local_88.decUI = local_70.decUI;
        uStack_80 = CONCAT44(uStack_64,uStack_68);
      }
LAB_001ce663:
      Scanner::setError(*(Scanner **)
                         &((this->Doc->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner,(Twine *)&local_88,(iterator)local_b8);
      if (local_a8 != (ulong *)&local_98) {
        uVar6 = CONCAT71(uStack_97,local_98);
        puVar11 = local_a8;
        goto LAB_001ce68f;
      }
    }
    else {
      p_Var3 = cVar8._M_node[1]._M_left;
      if (p_Var3 == (_Base_ptr)0x0) {
        local_c0 = &uStack_b0;
        local_b8 = (short *)0x0;
        uStack_b0 = uStack_b0 & 0xffffffffffffff00;
      }
      else {
        local_c0 = &uStack_b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,p_Var3,
                   (long)&p_Var3->_M_color + (long)&(cVar8._M_node[1]._M_right)->_M_color);
      }
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
      uVar6 = uStack_b0;
      puVar11 = local_c0;
      if (local_c0 != &uStack_b0) {
LAB_001ce68f:
        operator_delete(puVar11,uVar6 + 1);
      }
    }
    do {
      uVar6 = uVar7;
      if (uVar6 == 0) break;
      uVar7 = uVar6 - 1;
    } while (*(char *)((long)psVar2 + (uVar6 - 1)) != '!');
    bVar12 = uVar1 < uVar6;
  }
  else {
    local_88.twine = (Twine *)0x1fc04a;
    uStack_80 = 2;
    cVar8 = std::
            _Rb_tree<llvm::StringRef,_std::pair<const_llvm::StringRef,_llvm::StringRef>,_std::_Select1st<std::pair<const_llvm::StringRef,_llvm::StringRef>_>,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
            ::find(&(((this->Doc->_M_t).
                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->TagMap).
                    _M_t,(key_type *)&local_88);
    p_Var3 = cVar8._M_node[1]._M_left;
    if (p_Var3 == (_Base_ptr)0x0) {
      local_c0 = &uStack_b0;
      local_b8 = (short *)0x0;
      uStack_b0 = uStack_b0 & 0xffffffffffffff00;
    }
    else {
      local_c0 = &uStack_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,p_Var3,
                 (long)&p_Var3->_M_color + (long)&(cVar8._M_node[1]._M_right)->_M_color);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
    if (local_c0 != &uStack_b0) {
      operator_delete(local_c0,uStack_b0 + 1);
    }
    bVar12 = uVar1 < 2;
    uVar6 = 2;
  }
  if (bVar12) {
    uVar6 = uVar1;
  }
  pcVar9 = (char *)((long)psVar2 + uVar6);
LAB_001ce6b8:
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar9);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::getVerbatimTag() const {
  StringRef Raw = getRawTag();
  if (!Raw.empty() && Raw != "!") {
    std::string Ret;
    if (Raw.find_last_of('!') == 0) {
      Ret = Doc->getTagMap().find("!")->second;
      Ret += Raw.substr(1);
      return Ret;
    } else if (Raw.startswith("!!")) {
      Ret = Doc->getTagMap().find("!!")->second;
      Ret += Raw.substr(2);
      return Ret;
    } else {
      StringRef TagHandle = Raw.substr(0, Raw.find_last_of('!') + 1);
      std::map<StringRef, StringRef>::const_iterator It =
          Doc->getTagMap().find(TagHandle);
      if (It != Doc->getTagMap().end())
        Ret = It->second;
      else {
        Token T;
        T.Kind = Token::TK_Tag;
        T.Range = TagHandle;
        setError(Twine("Unknown tag handle ") + TagHandle, T);
      }
      Ret += Raw.substr(Raw.find_last_of('!') + 1);
      return Ret;
    }
  }

  switch (getType()) {
  case NK_Null:
    return "tag:yaml.org,2002:null";
  case NK_Scalar:
  case NK_BlockScalar:
    // TODO: Tag resolution.
    return "tag:yaml.org,2002:str";
  case NK_Mapping:
    return "tag:yaml.org,2002:map";
  case NK_Sequence:
    return "tag:yaml.org,2002:seq";
  }

  return "";
}